

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

int __thiscall HPresolve::getSingColElementIndexInA(HPresolve *this,int j)

{
  reference pvVar1;
  ostream *poVar2;
  int in_ESI;
  bool bVar3;
  int rest;
  int k;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_1c;
  int local_18;
  int local_4;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  local_18 = *pvVar1;
  while( true ) {
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8);
    if (*pvVar1 != 0) break;
    local_18 = local_18 + 1;
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  local_1c = local_18;
  if (local_18 < *pvVar1) {
    do {
      local_1c = local_1c + 1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      bVar3 = false;
      if (local_1c < *pvVar1) {
        std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
        bVar3 = *pvVar1 == 0;
      }
    } while (bVar3);
    pvVar1 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(local_1c,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
    if (local_1c < *pvVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Error during presolve: more variables found in singleton col ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
      std::operator<<(poVar2,".");
      local_4 = -1;
    }
    else {
      local_4 = local_18;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Error during presolve: no variable found in singleton col ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    std::operator<<(poVar2,".");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int HPresolve::getSingColElementIndexInA(int j) {
	int k=Astart.at(j);
    while (!flagRow.at(Aindex.at(k)))
           ++k ;
    if (k >= Aend.at(j)) {
		cout<<"Error during presolve: no variable found in singleton col "<<j<<".";
		return -1;
	}
    int rest = k+1;
	while (rest < Aend.at(j) && !flagRow.at(Aindex.at(rest)))
		++rest ;
	if (rest < Aend.at(j)) {
		cout<<"Error during presolve: more variables found in singleton col "<<j<<".";
		return -1;
	}
    return k;
}